

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkTryNewMiter(char *pFileName0,char *pFileName1)

{
  int iVar1;
  undefined1 auVar2 [16];
  Cnf_Dat_t *p;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk_01;
  Gia_Man_t *pGia;
  int *pVars;
  sat_solver *s;
  int *piVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int Lit;
  int local_5c;
  ulong local_58;
  long local_50;
  Vec_Ptr_t *local_48;
  Cnf_Dat_t *local_40;
  void **local_38;
  long lVar11;
  
  pNtk = Io_Read(pFileName0,IO_FILE_VERILOG,1,0);
  pNtk_00 = Io_Read(pFileName1,IO_FILE_VERILOG,1,0);
  pNtk1 = Abc_NtkStrash(pNtk,1,1,0);
  pNtk2 = Abc_NtkStrash(pNtk_00,1,1,0);
  pNtk_01 = Abc_NtkMiter(pNtk1,pNtk2,1,0,0,1);
  pGia = Abc_NtkClpGia(pNtk_01);
  if (pNtk->vCis->nSize != pNtk_00->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x4c1,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
  }
  if (pNtk->vCos->nSize != pNtk_00->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x4c2,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
  }
  Abc_NtkDelete(pNtk);
  Abc_NtkDelete(pNtk_00);
  Abc_NtkDelete(pNtk1);
  Abc_NtkDelete(pNtk2);
  Abc_NtkDelete(pNtk_01);
  lVar8 = (long)pGia->vCos->nSize - (long)pGia->nRegs;
  local_48 = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < (int)lVar8 - 1U) {
    iVar5 = (int)lVar8;
  }
  local_48->nCap = iVar5;
  local_50 = lVar8;
  if (iVar5 == 0) {
    local_38 = (void **)0x0;
  }
  else {
    local_38 = (void **)malloc((long)iVar5 << 3);
  }
  local_48->pArray = local_38;
  local_48->nSize = (int)local_50;
  memset(local_38,0,local_50 * 8);
  local_40 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,0,0,0);
  iVar5 = pGia->nRegs;
  iVar7 = pGia->vCis->nSize;
  uVar4 = iVar7 - iVar5;
  local_58 = (ulong)uVar4;
  iVar1 = local_40->nVars;
  pVars = (int *)malloc((long)(int)uVar4 * 4);
  p = local_40;
  auVar2 = _DAT_00912220;
  if (0 < (int)uVar4) {
    lVar8 = (local_58 & 0xffffffff) - 1;
    auVar9._8_4_ = (int)lVar8;
    auVar9._0_8_ = lVar8;
    auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
    iVar7 = (iVar5 + iVar1) - iVar7;
    lVar8 = 1;
    auVar9 = auVar9 ^ _DAT_00912220;
    auVar10 = _DAT_00912210;
    do {
      auVar12 = auVar10 ^ auVar2;
      if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                  auVar9._4_4_ < auVar12._4_4_) & 1)) {
        pVars[lVar8 + -1] = iVar7;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        pVars[lVar8] = iVar7 + 1;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar11 = lVar8 - (ulong)((int)local_58 + 1U & 0xfffffffe);
      lVar8 = lVar8 + 2;
      iVar7 = iVar7 + 2;
    } while (lVar11 != -1);
  }
  s = (sat_solver *)Cnf_DataWriteIntoSolver(local_40,1,0);
  Cnf_DataFree(p);
  if (pGia->nRegs < pGia->vCos->nSize) {
    iVar5 = 2;
    uVar6 = 0;
    do {
      local_5c = iVar5;
      iVar7 = sat_solver_solve(s,&local_5c,(lit *)&local_58,100000,0,0,0);
      if (iVar7 != -1) {
        if (iVar7 == 0) {
          __assert_fail("status != l_Undef",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                        ,0x4d5,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
        }
        piVar3 = Sat_SolverGetModel(s,pVars,(int)local_58);
        if (local_50 <= (long)uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        local_38[uVar6] = piVar3;
        printf("Output %3d (out of %3d) is SAT.\n",uVar6 & 0xffffffff,
               (ulong)(uint)(pGia->vCos->nSize - pGia->nRegs));
      }
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + 2;
    } while ((long)uVar6 < (long)pGia->vCos->nSize - (long)pGia->nRegs);
  }
  Gia_ManStop(pGia);
  sat_solver_delete(s);
  if (pVars != (int *)0x0) {
    free(pVars);
  }
  return local_48;
}

Assistant:

Vec_Ptr_t * Abc_NtkTryNewMiter( char * pFileName0, char * pFileName1 )
{
    extern void * Cnf_DataWriteIntoSolver2( Cnf_Dat_t * p, int nFrames, int fInit );
    int i, nVars, * pVars, iCiVarBeg, iCoVarBeg = 1, nBTLimit = 100000;
    sat_solver * pSat  = NULL;
    Cnf_Dat_t * pCnf   = NULL;
    Vec_Ptr_t * vCexes = NULL;
    Abc_Ntk_t * pNtk1  = Io_Read( pFileName0, IO_FILE_VERILOG, 1, 0 );
    Abc_Ntk_t * pNtk2  = Io_Read( pFileName1, IO_FILE_VERILOG, 1, 0 );
    Abc_Ntk_t * pNtk1_ = Abc_NtkStrash( pNtk1, 1, 1, 0 );
    Abc_Ntk_t * pNtk2_ = Abc_NtkStrash( pNtk2, 1, 1, 0 );
    Abc_Ntk_t * pMiter = Abc_NtkMiter( pNtk1_, pNtk2_, 1, 0, 0, 1 );
    Gia_Man_t * pGia = Abc_NtkClpGia( pMiter );
    assert( Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2) );
    assert( Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2) );
    Abc_NtkDelete( pNtk1 );
    Abc_NtkDelete( pNtk2 );
    Abc_NtkDelete( pNtk1_ );
    Abc_NtkDelete( pNtk2_ );
    Abc_NtkDelete( pMiter );
    vCexes = Vec_PtrStart( Gia_ManPoNum(pGia) );
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 0, 0, 0 );
    nVars = Gia_ManPiNum(pGia);
    iCiVarBeg = pCnf->nVars - nVars;
    pVars = ABC_ALLOC( int, nVars );
    for ( i = 0; i < nVars; i++ )
        pVars[i] = iCiVarBeg + i;
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    Cnf_DataFree( pCnf );
    for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
    {
        int Lit = Abc_Var2Lit( iCoVarBeg + i, 0 );
        int status = sat_solver_solve( pSat, &Lit, &Lit + 1, nBTLimit, 0, 0, 0 );
        assert( status != l_Undef );
        if ( status == l_False )
            continue;
        Vec_PtrWriteEntry( vCexes, i, Sat_SolverGetModel(pSat, pVars, nVars) );
        printf( "Output %3d (out of %3d) is SAT.\n", i, Gia_ManPoNum(pGia) );
    }
    Gia_ManStop( pGia );
    sat_solver_delete( pSat );
    ABC_FREE( pVars );
    return vCexes;
}